

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O0

uint32_t __thiscall spvtools::opt::InstrumentPass::GetBoolId(InstrumentPass *this)

{
  uint32_t uVar1;
  IRContext *this_00;
  Type *type;
  Type *reg_bool_ty;
  Bool bool_ty;
  TypeManager *type_mgr;
  InstrumentPass *this_local;
  
  if (this->bool_id_ == 0) {
    this_00 = Pass::context(&this->super_Pass);
    bool_ty.super_Type._32_8_ = IRContext::get_type_mgr(this_00);
    analysis::Bool::Bool((Bool *)&reg_bool_ty);
    type = analysis::TypeManager::GetRegisteredType
                     ((TypeManager *)bool_ty.super_Type._32_8_,(Type *)&reg_bool_ty);
    uVar1 = analysis::TypeManager::GetTypeInstruction((TypeManager *)bool_ty.super_Type._32_8_,type)
    ;
    this->bool_id_ = uVar1;
    analysis::Bool::~Bool((Bool *)&reg_bool_ty);
  }
  return this->bool_id_;
}

Assistant:

uint32_t InstrumentPass::GetBoolId() {
  if (bool_id_ == 0) {
    analysis::TypeManager* type_mgr = context()->get_type_mgr();
    analysis::Bool bool_ty;
    analysis::Type* reg_bool_ty = type_mgr->GetRegisteredType(&bool_ty);
    bool_id_ = type_mgr->GetTypeInstruction(reg_bool_ty);
  }
  return bool_id_;
}